

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

logic_t __thiscall slang::SVInt::reductionOr(SVInt *this)

{
  uint64_t *puVar1;
  bool bVar2;
  uint64_t *puVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  uint8_t uVar7;
  
  bVar2 = (this->super_SVIntStorage).unknownFlag;
  uVar4 = (this->super_SVIntStorage).bitWidth;
  if (bVar2 == true) {
    uVar7 = 0x80;
    if (0x3f < uVar4 + 0x3f) {
      puVar3 = (this->super_SVIntStorage).field_0.pVal;
      uVar4 = uVar4 + 0x3f >> 6;
      lVar6 = 0;
      do {
        if ((puVar3[lVar6] & ~puVar3[(ulong)uVar4 + lVar6]) != 0) {
          return (logic_t)'\x01';
        }
        lVar6 = lVar6 + 1;
      } while (uVar4 != (uint)lVar6);
    }
  }
  else {
    if (uVar4 < 0x41) {
      return (logic_t)((this->super_SVIntStorage).field_0.val != 0);
    }
    uVar5 = (uVar4 + 0x3f >> 6) << (bVar2 & 0x1fU);
    uVar7 = 0x3f < uVar4 + 0x3f;
    if (((bool)uVar7) && (puVar3 = (this->super_SVIntStorage).field_0.pVal, *puVar3 == 0)) {
      lVar6 = 1;
      do {
        uVar4 = (uint)lVar6;
        if (uVar5 + (uVar5 == 0) == uVar4) break;
        puVar1 = puVar3 + lVar6;
        lVar6 = lVar6 + 1;
      } while (*puVar1 == 0);
      return (logic_t)(uVar4 < uVar5);
    }
  }
  return (logic_t)uVar7;
}

Assistant:

logic_t SVInt::reductionOr() const {
    if (unknownFlag) {
        uint32_t words = getNumWords(bitWidth, false);
        for (uint32_t i = 0; i < words; i++) {
            if (pVal[i] & ~pVal[i + words])
                return logic_t(true);
        }
        return logic_t::x;
    }

    if (isSingleWord())
        return logic_t(val != 0);
    else {
        for (uint32_t i = 0; i < getNumWords(); i++) {
            if (pVal[i] != 0)
                return logic_t(true);
        }
    }
    return logic_t(false);
}